

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

LogicalType * duckdb::DBConfig::ParseLogicalType(LogicalType *__return_storage_ptr__,string *type)

{
  bool bVar1;
  LogicalTypeId id;
  long lVar2;
  reference pvVar3;
  InternalException *pIVar4;
  ulong uVar5;
  idx_t index;
  int iVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this;
  string *this_00;
  string map_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  map_args_vect;
  LogicalType child_type;
  LogicalType value_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  union_member_parts;
  LogicalType value_type_1;
  optional_idx local_258;
  child_list_t<LogicalType> local_250;
  child_list_t<LogicalType> local_238;
  LogicalType local_220;
  LogicalType local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::string((string *)&map_args,"[]",(allocator *)&child_type);
  bVar1 = StringUtil::EndsWith(type,&map_args);
  ::std::__cxx11::string::~string((string *)&map_args);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)&map_args,(ulong)type);
    ParseLogicalType(&child_type,&map_args);
    ::std::__cxx11::string::~string((string *)&map_args);
    LogicalType::LIST(__return_storage_ptr__,&child_type);
LAB_01466af6:
    LogicalType::~LogicalType(&child_type);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)&map_args,"]",(allocator *)&child_type);
  bVar1 = StringUtil::EndsWith(type,&map_args);
  ::std::__cxx11::string::~string((string *)&map_args);
  if (bVar1) {
    lVar2 = ::std::__cxx11::string::rfind((char)type,0x5b);
    uVar5 = lVar2 + 1;
    if (uVar5 < 2) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&map_args,"Ill formatted type: \'%s\'",(allocator *)&child_type);
      ::std::__cxx11::string::string((string *)&local_50,(string *)type);
      InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_50);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    index = 0;
    for (; uVar5 < type->_M_string_length - 1; uVar5 = uVar5 + 1) {
      iVar6 = (int)(type->_M_dataplus)._M_p[uVar5];
      if (9 < iVar6 - 0x30U) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&map_args,"Ill formatted array type: \'%s\'",(allocator *)&child_type);
        ::std::__cxx11::string::string((string *)&local_70,(string *)type);
        InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_70);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      index = (index * 10 + (long)iVar6) - 0x30;
    }
    if (index - 0x186a1 < 0xfffffffffffe7960) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&map_args,"Invalid array size: \'%s\'",(allocator *)&child_type);
      ::std::__cxx11::string::string((string *)&local_90,(string *)type);
      InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_90);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::substr((ulong)&map_args,(ulong)type);
    ParseLogicalType(&child_type,&map_args);
    ::std::__cxx11::string::~string((string *)&map_args);
    optional_idx::optional_idx(&local_258,index);
    LogicalType::ARRAY(__return_storage_ptr__,&child_type,local_258);
    goto LAB_01466af6;
  }
  ::std::__cxx11::string::string((string *)&local_150,(string *)type);
  ::std::__cxx11::string::string((string *)&local_170,"MAP(",(allocator *)&child_type);
  bVar1 = StringUtil::StartsWith(&local_150,&local_170);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&map_args,")",(allocator *)&map_args_vect);
    bVar1 = StringUtil::EndsWith(type,&map_args);
    ::std::__cxx11::string::~string((string *)&map_args);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_150);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)&map_args,(ulong)type);
      StringUtil::SplitWithParentheses(&map_args_vect,&map_args,',','(',')');
      if ((long)map_args_vect.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)map_args_vect.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_type,"Ill formatted map type: \'%s\'",(allocator *)&value_type);
        ::std::__cxx11::string::string((string *)&local_b0,(string *)type);
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar4,(string *)&child_type,&local_b0);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,0);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,1);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,0);
      ParseLogicalType(&child_type,pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,1);
      ParseLogicalType(&value_type,pvVar3);
      LogicalType::LogicalType(&local_208,&child_type);
      LogicalType::LogicalType(&local_220,&value_type);
      LogicalType::MAP(__return_storage_ptr__,&local_208,&local_220);
      LogicalType::~LogicalType(&local_220);
      LogicalType::~LogicalType(&local_208);
      LogicalType::~LogicalType(&value_type);
      LogicalType::~LogicalType(&child_type);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&map_args_vect);
      this_00 = &map_args;
      goto LAB_014670cc;
    }
  }
  else {
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_150);
  }
  ::std::__cxx11::string::string((string *)&local_190,(string *)type);
  ::std::__cxx11::string::string((string *)&local_1b0,"UNION(",(allocator *)&child_type);
  bVar1 = StringUtil::StartsWith(&local_190,&local_1b0);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&map_args,")",(allocator *)&map_args_vect);
    bVar1 = StringUtil::EndsWith(type,&map_args);
    ::std::__cxx11::string::~string((string *)&map_args);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_190);
    if (!bVar1) goto LAB_01466d36;
    ::std::__cxx11::string::substr((ulong)&child_type,(ulong)type);
    StringUtil::SplitWithParentheses(&map_args_vect,(string *)&child_type,',','(',')');
    value_type.id_ = INVALID;
    value_type.physical_type_ = ~INVALID;
    value_type._2_6_ = 0;
    value_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    value_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)map_args_vect.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)map_args_vect.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,uVar5);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,uVar5);
      StringUtil::SplitWithParentheses(&union_member_parts,pvVar3,' ','(',')');
      if ((long)union_member_parts.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)union_member_parts.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&map_args,"Ill formatted union type: %s",(allocator *)&value_type_1);
        ::std::__cxx11::string::string((string *)&local_d0,(string *)type);
        InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_d0);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,0);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,1);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,1);
      ParseLogicalType(&value_type_1,pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,0);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&map_args,pvVar3,&value_type_1);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&value_type,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&map_args);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
               *)&map_args);
      LogicalType::~LogicalType(&value_type_1);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&union_member_parts);
    }
    if (((element_type *)value_type._0_8_ ==
         value_type.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
       (0x100 < (ulong)(((long)value_type.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr - value_type._0_8_) / 0x38))) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&map_args,"Invalid number of union members: \'%s\'",
                 (allocator *)&union_member_parts);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)type);
      InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_f0);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_238,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&value_type);
    LogicalType::UNION(__return_storage_ptr__,&local_238);
    this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_238;
  }
  else {
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_190);
LAB_01466d36:
    ::std::__cxx11::string::string((string *)&local_1d0,(string *)type);
    ::std::__cxx11::string::string((string *)&local_1f0,"STRUCT(",(allocator *)&child_type);
    bVar1 = StringUtil::StartsWith(&local_1d0,&local_1f0);
    if (!bVar1) {
      ::std::__cxx11::string::~string((string *)&local_1f0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
LAB_01466f3b:
      ::std::__cxx11::string::string((string *)&map_args,"ANY",(allocator *)&child_type);
      bVar1 = StringUtil::CIEquals(type,&map_args);
      id = ANY;
      if (!bVar1) {
        id = TransformStringToLogicalTypeId(type);
      }
      LogicalType::LogicalType(__return_storage_ptr__,id);
      ::std::__cxx11::string::~string((string *)&map_args);
      LogicalType::LogicalType((LogicalType *)&map_args,USER);
      bVar1 = LogicalType::operator==(__return_storage_ptr__,(LogicalType *)&map_args);
      LogicalType::~LogicalType((LogicalType *)&map_args);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&map_args,
                 "Error while generating extension function overloads - unrecognized logical type %s"
                 ,(allocator *)&child_type);
      ::std::__cxx11::string::string((string *)&local_130,(string *)type);
      InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_130);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string((string *)&map_args,")",(allocator *)&map_args_vect);
    bVar1 = StringUtil::EndsWith(type,&map_args);
    ::std::__cxx11::string::~string((string *)&map_args);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    if (!bVar1) goto LAB_01466f3b;
    ::std::__cxx11::string::substr((ulong)&child_type,(ulong)type);
    StringUtil::SplitWithParentheses(&map_args_vect,(string *)&child_type,',','(',')');
    value_type.id_ = INVALID;
    value_type.physical_type_ = ~INVALID;
    value_type._2_6_ = 0;
    value_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    value_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)map_args_vect.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)map_args_vect.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,uVar5);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&map_args_vect,uVar5);
      StringUtil::SplitWithParentheses(&union_member_parts,pvVar3,' ','(',')');
      if ((long)union_member_parts.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)union_member_parts.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&map_args,"Ill formatted struct type: %s",(allocator *)&value_type_1);
        ::std::__cxx11::string::string((string *)&local_110,(string *)type);
        InternalException::InternalException<std::__cxx11::string>(pIVar4,&map_args,&local_110);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,0);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,1);
      StringUtil::Trim(pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,1);
      ParseLogicalType(&value_type_1,pvVar3);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&union_member_parts,0);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&map_args,pvVar3,&value_type_1);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&value_type,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&map_args);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
               *)&map_args);
      LogicalType::~LogicalType(&value_type_1);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&union_member_parts);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_250,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&value_type);
    LogicalType::STRUCT(__return_storage_ptr__,&local_250);
    this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_250;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(this);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&value_type);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&map_args_vect);
  this_00 = (string *)&child_type;
LAB_014670cc:
  ::std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

LogicalType DBConfig::ParseLogicalType(const string &type) {
	if (StringUtil::EndsWith(type, "[]")) {
		// list - recurse
		auto child_type = ParseLogicalType(type.substr(0, type.size() - 2));
		return LogicalType::LIST(child_type);
	}

	if (StringUtil::EndsWith(type, "]")) {
		// array - recurse
		auto bracket_open_idx = type.rfind('[');
		if (bracket_open_idx == DConstants::INVALID_INDEX || bracket_open_idx == 0) {
			throw InternalException("Ill formatted type: '%s'", type);
		}
		idx_t array_size = 0;
		for (auto length_idx = bracket_open_idx + 1; length_idx < type.size() - 1; length_idx++) {
			if (!isdigit(type[length_idx])) {
				throw InternalException("Ill formatted array type: '%s'", type);
			}
			array_size = array_size * 10 + static_cast<idx_t>(type[length_idx] - '0');
		}
		if (array_size == 0 || array_size > ArrayType::MAX_ARRAY_SIZE) {
			throw InternalException("Invalid array size: '%s'", type);
		}
		auto child_type = ParseLogicalType(type.substr(0, bracket_open_idx));
		return LogicalType::ARRAY(child_type, array_size);
	}

	if (StringUtil::StartsWith(type, "MAP(") && StringUtil::EndsWith(type, ")")) {
		// map - recurse
		string map_args = type.substr(4, type.size() - 5);
		vector<string> map_args_vect = StringUtil::SplitWithParentheses(map_args);
		if (map_args_vect.size() != 2) {
			throw InternalException("Ill formatted map type: '%s'", type);
		}
		StringUtil::Trim(map_args_vect[0]);
		StringUtil::Trim(map_args_vect[1]);
		auto key_type = ParseLogicalType(map_args_vect[0]);
		auto value_type = ParseLogicalType(map_args_vect[1]);
		return LogicalType::MAP(key_type, value_type);
	}

	if (StringUtil::StartsWith(type, "UNION(") && StringUtil::EndsWith(type, ")")) {
		// union - recurse
		string union_members_str = type.substr(6, type.size() - 7);
		vector<string> union_members_vect = StringUtil::SplitWithParentheses(union_members_str);
		child_list_t<LogicalType> union_members;
		for (idx_t member_idx = 0; member_idx < union_members_vect.size(); member_idx++) {
			StringUtil::Trim(union_members_vect[member_idx]);
			vector<string> union_member_parts = StringUtil::SplitWithParentheses(union_members_vect[member_idx], ' ');
			if (union_member_parts.size() != 2) {
				throw InternalException("Ill formatted union type: %s", type);
			}
			StringUtil::Trim(union_member_parts[0]);
			StringUtil::Trim(union_member_parts[1]);
			auto value_type = ParseLogicalType(union_member_parts[1]);
			union_members.emplace_back(make_pair(union_member_parts[0], value_type));
		}
		if (union_members.empty() || union_members.size() > UnionType::MAX_UNION_MEMBERS) {
			throw InternalException("Invalid number of union members: '%s'", type);
		}
		return LogicalType::UNION(union_members);
	}

	if (StringUtil::StartsWith(type, "STRUCT(") && StringUtil::EndsWith(type, ")")) {
		// struct - recurse
		string struct_members_str = type.substr(7, type.size() - 8);
		vector<string> struct_members_vect = StringUtil::SplitWithParentheses(struct_members_str);
		child_list_t<LogicalType> struct_members;
		for (idx_t member_idx = 0; member_idx < struct_members_vect.size(); member_idx++) {
			StringUtil::Trim(struct_members_vect[member_idx]);
			vector<string> struct_member_parts = StringUtil::SplitWithParentheses(struct_members_vect[member_idx], ' ');
			if (struct_member_parts.size() != 2) {
				throw InternalException("Ill formatted struct type: %s", type);
			}
			StringUtil::Trim(struct_member_parts[0]);
			StringUtil::Trim(struct_member_parts[1]);
			auto value_type = ParseLogicalType(struct_member_parts[1]);
			struct_members.emplace_back(make_pair(struct_member_parts[0], value_type));
		}
		return LogicalType::STRUCT(struct_members);
	}

	LogicalType type_id = StringUtil::CIEquals(type, "ANY") ? LogicalType::ANY : TransformStringToLogicalTypeId(type);
	if (type_id == LogicalTypeId::USER) {
		throw InternalException("Error while generating extension function overloads - unrecognized logical type %s",
		                        type);
	}
	return type_id;
}